

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CaseAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CaseAssertionExpr,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul>,slang::ast::AssertionExpr_const*&>
          (BumpAllocator *this,Expression *args,
          span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *args_1,
          AssertionExpr **args_2)

{
  span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *expr;
  CaseAssertionExpr *this_00;
  span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> local_38;
  AssertionExpr **local_28;
  AssertionExpr **args_local_2;
  span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *args_local_1;
  Expression *args_local;
  BumpAllocator *this_local;
  
  local_28 = args_2;
  args_local_2 = (AssertionExpr **)args_1;
  args_local_1 = (span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)args;
  args_local = (Expression *)this;
  this_00 = (CaseAssertionExpr *)allocate(this,0x30,8);
  expr = args_local_1;
  nonstd::span_lite::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::
  span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL,_0>
            (&local_38,
             (span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)args_local_2)
  ;
  ast::CaseAssertionExpr::CaseAssertionExpr(this_00,(Expression *)expr,local_38,*local_28);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }